

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Unmarshall.c
# Opt level: O0

WJTL_STATUS TestUnmarshallListAlreadyHasContents(void)

{
  int iVar1;
  JL_STATUS JVar2;
  bool bVar3;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  TheStruct theStruct;
  JlMarshallElement marshalTheStruct [1];
  size_t errorAtPos;
  WJTL_STATUS TestReturn;
  
  errorAtPos._4_4_ = WJTL_STATUS_SUCCESS;
  marshalTheStruct[0].ChildStructDescriptionCount = 0;
  marshalTheStruct[0]._92_4_ = 0;
  memcpy(&theStruct.NumArrayCount,&DAT_0014f530,0x60);
  memset(&_result_7,0,0x10);
  JVar2 = JlJsonToStruct("{\"NumList\":[1,2]}",(JlMarshallElement *)&theStruct.NumArrayCount,1,
                         &_result_7,(size_t *)&marshalTheStruct[0].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumList\\\":[1,2]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57a);
  if (JVar2 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalTheStruct[0]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57b);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = theStruct.NumArray == (uint32_t *)0x2;
  WjTestLib_Assert(bVar3,"2 == theStruct.NumArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57c);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *__result_7;
  WjTestLib_Assert(iVar1 == 1,"1 == theStruct.NumArray[0]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57d);
  if (iVar1 != 1) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = __result_7[1];
  WjTestLib_Assert(iVar1 == 2,"2 == theStruct.NumArray[1]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x57e);
  if (iVar1 != 2) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlJsonToStruct("{\"NumList\":[3]}",(JlMarshallElement *)&theStruct.NumArrayCount,1,
                         &_result_7,(size_t *)&marshalTheStruct[0].ChildStructDescriptionCount);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlJsonToStruct( \"{\\\"NumList\\\":[3]}\", marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x581);
  if (JVar2 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  bVar3 = marshalTheStruct[0]._88_8_ == 0;
  WjTestLib_Assert(bVar3,"0 == errorAtPos",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x582);
  if (!bVar3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(theStruct.NumArray == (uint32_t *)0x1,"1 == theStruct.NumArrayCount",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x583);
  if (theStruct.NumArray != (uint32_t *)0x1) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  iVar1 = *__result_7;
  WjTestLib_Assert(iVar1 == 3,"3 == theStruct.NumArray[0]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x584);
  if (iVar1 != 3) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  JVar2 = JlUnmarshallFreeStructAllocs((JlMarshallElement *)&theStruct.NumArrayCount,1,&_result_7);
  WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlUnmarshallFreeStructAllocs( marshalTheStruct, ( sizeof(marshalTheStruct) / sizeof((marshalTheStruct)[0]) ), &theStruct ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Unmarshall.c"
                   ,"TestUnmarshallListAlreadyHasContents",0x587);
  if (JVar2 != JL_STATUS_SUCCESS) {
    errorAtPos._4_4_ = WJTL_STATUS_FAILED;
  }
  return errorAtPos._4_4_;
}

Assistant:

static
WJTL_STATUS
    TestUnmarshallListAlreadyHasContents
    (
        void
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;
    size_t errorAtPos = 0;

    typedef struct
    {
        uint32_t*   NumArray;
        size_t      NumArrayCount;
    } TheStruct;

    JlMarshallElement marshalTheStruct[] = {
        JlMarshallUnsignedArray( TheStruct, NumArray, NumArrayCount, "NumList" )
    };

    TheStruct theStruct = {0};

    // Fill in struct with values
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumList\":[1,2]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 2 == theStruct.NumArrayCount );
    JL_ASSERT( 1 == theStruct.NumArray[0] );
    JL_ASSERT( 2 == theStruct.NumArray[1] );

    // Now unmarshall again when struct already has a list with contents.
    JL_ASSERT_SUCCESS( JlJsonToStruct( "{\"NumList\":[3]}", marshalTheStruct, NumElements(marshalTheStruct), &theStruct, &errorAtPos ) );
    JL_ASSERT( 0 == errorAtPos );
    JL_ASSERT( 1 == theStruct.NumArrayCount );
    JL_ASSERT( 3 == theStruct.NumArray[0] );

    // Free and make sure no memory leak
    JL_ASSERT_SUCCESS( JlUnmarshallFreeStructAllocs( marshalTheStruct, NumElements(marshalTheStruct), &theStruct ) );

    return TestReturn;
}